

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ITypeReader.h
# Opt level: O3

void __thiscall ITypeReader::ITypeReader(ITypeReader *this,ifstream *ifs,ostream *os,int deep)

{
  IAbstractReader::IAbstractReader(&this->super_IAbstractReader,ifs,os,deep,false);
  (this->super_IAbstractReader)._vptr_IAbstractReader = (_func_int **)&PTR_getWord_00110ae8;
  (this->m_last)._M_dataplus._M_p = (pointer)&(this->m_last).field_2;
  (this->m_last)._M_string_length = 0;
  (this->m_last).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_IAbstractReader).m_dataType,0,
             (char *)(this->super_IAbstractReader).m_dataType._M_string_length,0x10c22f);
  std::__cxx11::string::_M_replace
            ((ulong)&this->m_last,0,(char *)(this->m_last)._M_string_length,0x10c0b4);
  return;
}

Assistant:

explicit ITypeReader(std::ifstream* ifs,std::ostream* os,int deep) : IAbstractReader(ifs, os, deep) {
        m_dataType = "Type";
        m_last="";
    }